

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O3

bool __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
matchIf<soul::TokenType>
          (Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           *this,TokenType expected)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  
  __s1 = (this->currentType).text;
  if (__s1 == expected.text) {
LAB_001cee0a:
    skip(this);
    bVar1 = true;
  }
  else {
    if (expected.text != (char *)0x0 && __s1 != (char *)0x0) {
      iVar2 = strcmp(__s1,expected.text);
      if (iVar2 == 0) goto LAB_001cee0a;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool matchIf (Type expected)                                { if (matches (expected)) { skip(); return true; } return false; }